

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_bytestring.cc
# Opt level: O0

string * binpac::std_string_abi_cxx11_(bytestring *s)

{
  uchar *__end;
  uchar *__beg;
  datastring<unsigned_char> *in_RSI;
  string *in_RDI;
  string *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 local_11 [17];
  
  __a = in_RDI;
  local_11._1_8_ = in_RSI;
  __end = datastring<unsigned_char>::begin(in_RSI);
  __beg = datastring<unsigned_char>::end((datastring<unsigned_char> *)local_11._1_8_);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_11;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>
            (this,(char *)__beg,(char *)__end,(allocator<char> *)__a);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  return in_RDI;
}

Assistant:

std::string std_string(bytestring const* s)
	{
	return std::string((const char*)s->begin(), (const char*)s->end());
	}